

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Noise.cpp
# Opt level: O3

void setup_lattice(Vector *v,long *ix,long *iy,long *iz,long *jx,long *jy,long *jz,double *sx,
                  double *sy,double *sz,double *tx,double *ty,double *tz)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar4 = v->x + 10000.0;
  dVar2 = v->y + 10000.0;
  auVar1._8_4_ = SUB84(dVar2,0);
  auVar1._0_8_ = dVar4;
  auVar1._12_4_ = (int)((ulong)dVar2 >> 0x20);
  v->x = dVar4;
  v->y = (double)auVar1._8_8_;
  dVar3 = v->z + 10000.0;
  v->z = dVar3;
  *ix = (long)dVar4;
  *iy = (long)dVar2;
  *iz = (long)dVar3;
  *jx = *ix + 1;
  *jy = *iy + 1;
  *jz = *iz + 1;
  dVar4 = dVar4 - (double)*ix;
  *sx = (3.0 - (dVar4 + dVar4)) * dVar4 * dVar4;
  dVar4 = v->y - (double)*iy;
  *sy = (3.0 - (dVar4 + dVar4)) * dVar4 * dVar4;
  dVar4 = v->z - (double)*iz;
  *sz = (3.0 - (dVar4 + dVar4)) * dVar4 * dVar4;
  *tx = 1.0 - *sx;
  *ty = 1.0 - *sy;
  *tz = 1.0 - *sz;
  return;
}

Assistant:

void setup_lattice(  Vector&  v,
          long& ix,long&   iy,long& iz,
          long& jx,long&   jy,long& jz,
          double& sx,double&  sy,double& sz,
          double& tx,double&  ty,double& tz )
{
   // ensure values are positive
   v.x   -= MINX;
   v.y   -= MINY;
   v.z   -= MINZ;

   // integer lattice point
   ix = (long)v.x;   iy = (long)v.y;   iz = (long)v.z;
   jx = ix  + 1; jy  = iy + 1; jz = iz +  1;

   sx = spline(v.x   - ix); sy = spline(v.y - iy); sz = spline(v.z - iz);
   // complement values of sx,sy,sz
   tx = 1.0 - sx; ty =  1.0   - sy; tz = 1.0 - sz;
}